

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * Oppo(vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  undefined8 *puVar1;
  tensor *ptVar2;
  vector<tensor_*,_std::allocator<tensor_*>_> local_30;
  
  puVar1 = (undefined8 *)operator_new(0x48);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  node::node_cnt = node::node_cnt + 1;
  *puVar1 = &PTR_forward_0010a988;
  *(undefined1 *)(puVar1 + 8) = 0;
  *puVar1 = &PTR_forward_0010abf0;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_30,x);
  ptVar2 = (tensor *)(**(code **)*puVar1)(puVar1,&local_30);
  if (local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ptVar2;
}

Assistant:

tensor* Oppo(vector<tensor *> x){
    node *op = new OPPO();
    return op->forward(x);
}